

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O2

void __thiscall
MemoryLeakWarningPlugin::postTestAction
          (MemoryLeakWarningPlugin *this,UtestShell *test,TestResult *result)

{
  size_t sVar1;
  char *pcVar2;
  SimpleString SStack_98;
  TestFailure f;
  
  MemoryLeakDetector::stopChecking(this->memLeakDetector_);
  sVar1 = MemoryLeakDetector::totalMemoryLeaks(this->memLeakDetector_,mem_leak_period_checking);
  if (((this->ignoreAllWarnings_ == false) && (this->expectedLeaks_ != sVar1)) &&
     (this->failureCount_ == result->failureCount_)) {
    if (operator_new_fptr == mem_leak_operator_new ||
        operator_new_fptr == threadsafe_mem_leak_operator_new) {
      pcVar2 = MemoryLeakDetector::report(this->memLeakDetector_,mem_leak_period_checking);
      SimpleString::SimpleString(&SStack_98,pcVar2);
      TestFailure::TestFailure(&f,test,&SStack_98);
      SimpleString::~SimpleString(&SStack_98);
      (*result->_vptr_TestResult[0xd])(result,&f);
      TestFailure::~TestFailure(&f);
    }
    else if (this->expectedLeaks_ != 0) {
      StringFromFormat((char *)&f,"Warning: Expected %d leak(s), but leak detection was disabled");
      pcVar2 = SimpleString::asCharString((SimpleString *)&f);
      (*result->_vptr_TestResult[0xe])(result,pcVar2);
      SimpleString::~SimpleString((SimpleString *)&f);
    }
  }
  MemoryLeakDetector::markCheckingPeriodLeaksAsNonCheckingPeriod(this->memLeakDetector_);
  this->ignoreAllWarnings_ = false;
  this->expectedLeaks_ = 0;
  return;
}

Assistant:

void MemoryLeakWarningPlugin::postTestAction(UtestShell& test, TestResult& result)
{
    memLeakDetector_->stopChecking();
    size_t leaks = memLeakDetector_->totalMemoryLeaks(mem_leak_period_checking);

    if (!ignoreAllWarnings_ && expectedLeaks_ != leaks && failureCount_ == result.getFailureCount()) {
        if(MemoryLeakWarningPlugin::areNewDeleteOverloaded()) {
            TestFailure f(&test, memLeakDetector_->report(mem_leak_period_checking));
            result.addFailure(f);
        } else if(expectedLeaks_ > 0) {
            result.print(StringFromFormat("Warning: Expected %d leak(s), but leak detection was disabled", (int) expectedLeaks_).asCharString());
        }
    }
    memLeakDetector_->markCheckingPeriodLeaksAsNonCheckingPeriod();
    ignoreAllWarnings_ = false;
    expectedLeaks_ = 0;
}